

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

bool __thiscall
OSTEI_VRR_Algorithm_Base::HasVRROfType(OSTEI_VRR_Algorithm_Base *this,RRStepType steptype)

{
  bool bVar1;
  iterator this_00;
  RRStepType in_ESI;
  long in_RDI;
  VRRStep *it2;
  iterator __end2;
  iterator __begin2;
  set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *__range2;
  pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_> *it;
  const_iterator __end1;
  const_iterator __begin1;
  VRR_StepMap *__range1;
  reference in_stack_ffffffffffffffa8;
  _Self local_48;
  set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *local_40;
  reference local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  RRStepType local_14;
  
  local_20 = in_RDI + 0x160;
  local_14 = in_ESI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::begin((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::end((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
              *)in_stack_ffffffffffffffa8);
  do {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    local_38 = std::
               _Rb_tree_const_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                            *)0x123afd);
    local_40 = &local_38->second;
    local_48._M_node =
         (_Base_ptr)
         std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::begin
                   ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                    in_stack_ffffffffffffffa8);
    this_00 = std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::end
                        ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                         in_stack_ffffffffffffffa8);
    while (bVar1 = std::operator!=(&local_48,(_Self *)&stack0xffffffffffffffb0), bVar1) {
      in_stack_ffffffffffffffa8 =
           std::_Rb_tree_const_iterator<VRRStep>::operator*
                     ((_Rb_tree_const_iterator<VRRStep> *)0x123b4d);
      if (in_stack_ffffffffffffffa8->type == local_14) {
        return true;
      }
      std::_Rb_tree_const_iterator<VRRStep>::operator++
                ((_Rb_tree_const_iterator<VRRStep> *)this_00._M_node);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                  *)this_00._M_node);
  } while( true );
}

Assistant:

bool OSTEI_VRR_Algorithm_Base::HasVRROfType(RRStepType steptype) const
{
    for(const auto & it : vrrmap_)
    {
        for(const auto & it2 : it.second)
        {
            if(it2.type == steptype)
                return true;
        }
    }

    return false;
}